

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O0

void __thiscall
wasm::TranslateToFuzzReader::recombine(wasm::Function*)::Modder::visitExpression(wasm::Expression__
          (void *this,Expression *curr)

{
  bool bVar1;
  int iVar2;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *this_00;
  value_type *ppEVar3;
  undefined4 extraout_var;
  Expression *rep;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *candidates;
  Expression *curr_local;
  Modder *this_local;
  
  bVar1 = oneIn(*(TranslateToFuzzReader **)((long)this + 0xe8),10);
  if ((bVar1) &&
     (bVar1 = canBeArbitrarilyReplaced(*(TranslateToFuzzReader **)((long)this + 0xe8),curr), bVar1))
  {
    this_00 = InsertOrderedMap<wasm::Type,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
              ::operator[]((InsertOrderedMap<wasm::Type,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
                            *)(*(long *)((long)this + 0xe0) + 0xe0),&curr->type);
    bVar1 = std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::empty(this_00);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      __assert_fail("!candidates.empty()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                    ,0x30d,
                    "void wasm::TranslateToFuzzReader::recombine(Function *)::Modder::visitExpression(Expression *)"
                   );
    }
    ppEVar3 = pick<std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>
                        (*(TranslateToFuzzReader **)((long)this + 0xe8),this_00);
    iVar2 = ExpressionManipulator::copy
                      ((EVP_PKEY_CTX *)*ppEVar3,*(EVP_PKEY_CTX **)((long)this + 0xd8));
    Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::replaceCurrent
              ((Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_> *)this,
               (Expression *)CONCAT44(extraout_var,iVar2));
  }
  return;
}

Assistant:

void visitExpression(Expression* curr) {
      if (parent.oneIn(10) && parent.canBeArbitrarilyReplaced(curr)) {
        // Replace it!
        auto& candidates = scanner.exprsByType[curr->type];
        assert(!candidates.empty()); // this expression itself must be there
        auto* rep = parent.pick(candidates);
        replaceCurrent(ExpressionManipulator::copy(rep, wasm));
      }
    }